

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

void hash_destroyMap(void *data)

{
  if (data != (void *)0x0) {
    hash_destroyMap(*(void **)((long)data + 0x10));
    if (*data != (void *)0x0) {
      free(*data);
    }
    if (*(void **)((long)data + 8) != (void *)0x0) {
      free(*(void **)((long)data + 8));
    }
    free(data);
    return;
  }
  return;
}

Assistant:

void hash_destroyMap(void *data) {
#ifdef DEBUG
	printf("hash_destroyMap([void *])...\n");
#endif
	if ( data == NULL ) {
#ifdef DEBUG
		printf("hash_destroyMap([void *])... DONE\n");
#endif
		return;
	}
	linkedlist_t *map = (linkedlist_t *) data;
	hash_destroyMap(map->next);
	if ( map->key != NULL ) {
		free(map->key);
	}
	if ( map->value != NULL ) {
		free(map->value);
	}
	free(map);
#ifdef DEBUG
	printf("hash_destroyMap([void *])... DONE\n");
#endif
}